

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str>
          (pybind11 *this,handle *args_,handle *args__1,none *args__2,str *args__3)

{
  PyTypeObject *pPVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  handle *this_00;
  cast_error *this_01;
  PyObject **ppPVar6;
  handle local_1b0;
  iterator local_1a8;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_4UL> *__range2;
  int counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  undefined1 *local_140;
  undefined1 local_138 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  argtypes;
  size_t i;
  PyObject *local_a8;
  handle local_a0;
  PyObject *local_98;
  handle local_90;
  PyObject *local_88;
  handle local_70;
  PyObject *local_68;
  pybind11 *local_60;
  undefined1 local_58 [8];
  array<pybind11::object,_4UL> args;
  size_t size;
  str *args__local_3;
  none *args__local_2;
  handle *args__local_1;
  handle *args__local;
  tuple *result;
  
  args._M_elems[3].super_handle.m_ptr = (handle)(PyObject *)0x4;
  local_60 = (pybind11 *)local_58;
  handle::handle(&local_70,(PyObject *)0x0);
  local_68 = (PyObject *)
             detail::pyobject_caster<pybind11::handle>::cast(args_,automatic_reference,local_70);
  reinterpret_steal<pybind11::object>((pybind11 *)local_58,(handle)local_68);
  local_60 = (pybind11 *)&args;
  handle::handle(&local_90,(PyObject *)0x0);
  local_88 = (PyObject *)
             detail::pyobject_caster<pybind11::handle>::cast(args__1,automatic_reference,local_90);
  reinterpret_steal<pybind11::object>((pybind11 *)&args,(handle)local_88);
  local_60 = (pybind11 *)(args._M_elems + 1);
  handle::handle(&local_a0,(PyObject *)0x0);
  local_98 = (PyObject *)
             detail::pyobject_caster<pybind11::none>::cast
                       ((handle *)args__2,automatic_reference,local_a0);
  reinterpret_steal<pybind11::object>((pybind11 *)(args._M_elems + 1),(handle)local_98);
  local_60 = (pybind11 *)(args._M_elems + 2);
  handle::handle((handle *)&i,(PyObject *)0x0);
  local_a8 = (PyObject *)
             detail::pyobject_caster<pybind11::str>::cast
                       ((handle *)args__3,automatic_reference,(handle)i);
  reinterpret_steal<pybind11::object>((pybind11 *)(args._M_elems + 2),(handle)local_a8);
  argtypes._120_8_ = 0;
  while( true ) {
    uVar2 = argtypes._120_8_;
    sVar5 = std::array<pybind11::object,_4UL>::size((array<pybind11::object,_4UL> *)local_58);
    if (sVar5 <= (ulong)uVar2) {
      __range2._6_1_ = 0;
      tuple::tuple((tuple *)this,4);
      __range2._0_4_ = 0;
      __begin0 = (iterator)local_58;
      __end0 = std::array<pybind11::object,_4UL>::begin((array<pybind11::object,_4UL> *)__begin0);
      arg_value = std::array<pybind11::object,_4UL>::end((array<pybind11::object,_4UL> *)__begin0);
      while( true ) {
        if (__end0 == arg_value) {
          __range2._6_1_ = 1;
          std::array<pybind11::object,_4UL>::~array((array<pybind11::object,_4UL> *)local_58);
          return (object)(object)this;
        }
        local_1a8 = __end0;
        local_1b0 = object::release(__end0);
        ppPVar6 = handle::ptr(&local_1b0);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)this);
        iVar4 = PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar4 == 0) break;
        ppPVar6 = handle::ptr((handle *)this);
        (&(*ppPVar6)[1].ob_type)[(int)__range2] = pPVar1;
        __end0 = __end0 + 1;
        __range2._0_4_ = (int)__range2 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/cast.h"
                    ,0x658,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::handle, pybind11::handle, pybind11::none, pybind11::str>]"
                   );
    }
    this_00 = &std::array<pybind11::object,_4UL>::operator[]
                         ((array<pybind11::object,_4UL> *)local_58,argtypes._120_8_)->super_handle;
    bVar3 = handle::operator_cast_to_bool(this_00);
    if (!bVar3) break;
    argtypes._120_8_ = argtypes._120_8_ + 1;
  }
  local_140 = local_138;
  type_id<pybind11::handle>();
  local_140 = &argtypes.field_0x18;
  type_id<pybind11::handle>();
  local_140 = &argtypes.field_0x38;
  type_id<pybind11::none>();
  local_140 = &argtypes.field_0x58;
  type_id<pybind11::str>();
  __range2._7_1_ = 1;
  this_01 = (cast_error *)__cxa_allocate_exception(0x10);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_138,argtypes._120_8_);
  std::operator+((char *)&counter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "make_tuple(): unable to convert argument of type \'");
  std::operator+(local_160,(char *)&counter);
  cast_error::runtime_error(this_01,local_160);
  __range2._7_1_ = 0;
  __cxa_throw(this_01,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}